

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  GLint GVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  GPUShaderFP64Test1 *this_01;
  _uniform_function func;
  bool bVar7;
  GLint nondouble_uniform_locations [16];
  double double_data [16];
  GLint local_288 [4];
  GLint local_278;
  GLint local_274;
  GLint local_270;
  GLint local_26c;
  GLint local_268;
  GLint local_264;
  GLint local_260;
  GLint local_25c;
  GLint local_258;
  GLint local_254;
  GLint local_250;
  GLint local_24c;
  long local_248;
  GPUShaderFP64Test1 *local_240;
  undefined8 local_238 [17];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  puVar5 = &DAT_01a88860;
  puVar6 = local_238;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    puVar6 = puVar6 + 1;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_288[0] = this->m_po_bool_uniform_location;
  local_288[1] = this->m_po_bvec2_uniform_location;
  local_288[2] = this->m_po_bvec3_uniform_location;
  local_288[3] = this->m_po_bvec4_uniform_location;
  local_278 = this->m_po_float_uniform_location;
  local_274 = this->m_po_int_uniform_location;
  local_270 = this->m_po_ivec2_uniform_location;
  local_26c = this->m_po_ivec3_uniform_location;
  local_268 = this->m_po_ivec4_uniform_location;
  local_264 = this->m_po_uint_uniform_location;
  local_260 = this->m_po_uvec2_uniform_location;
  local_25c = this->m_po_uvec3_uniform_location;
  local_258 = this->m_po_uvec4_uniform_location;
  local_254 = this->m_po_vec2_uniform_location;
  local_250 = this->m_po_vec3_uniform_location;
  local_24c = this->m_po_vec4_uniform_location;
  local_240 = this;
  (**(code **)(lVar4 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xbf6);
  this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
  bVar7 = true;
  local_248 = 0;
  do {
    GVar1 = local_288[local_248];
    func = UNIFORM_FUNCTION_1D;
    do {
      switch(func) {
      case UNIFORM_FUNCTION_1D:
        (**(code **)(lVar4 + 0x14d0))(0,GVar1);
        break;
      case UNIFORM_FUNCTION_1DV:
        (**(code **)(lVar4 + 0x14d8))(GVar1,1,local_238);
        break;
      case UNIFORM_FUNCTION_2D:
        (**(code **)(lVar4 + 0x1510))(0,0x3ff0000000000000,GVar1);
        break;
      case UNIFORM_FUNCTION_2DV:
        (**(code **)(lVar4 + 0x1518))(GVar1,1,local_238);
        break;
      case UNIFORM_FUNCTION_3D:
        (**(code **)(lVar4 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000,GVar1);
        break;
      case UNIFORM_FUNCTION_3DV:
        (**(code **)(lVar4 + 0x1558))(GVar1,1,local_238);
        break;
      case UNIFORM_FUNCTION_4D:
        (**(code **)(lVar4 + 0x1590))
                  (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,GVar1);
        break;
      case UNIFORM_FUNCTION_4DV:
        (**(code **)(lVar4 + 0x1598))(GVar1,1,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX2DV:
        (**(code **)(lVar4 + 0x15d8))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX2X3DV:
        (**(code **)(lVar4 + 0x15e8))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX2X4DV:
        (**(code **)(lVar4 + 0x15f8))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX3DV:
        (**(code **)(lVar4 + 0x1608))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX3X2DV:
        (**(code **)(lVar4 + 0x1618))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX3X4DV:
        (**(code **)(lVar4 + 0x1628))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX4DV:
        (**(code **)(lVar4 + 0x1638))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX4X2DV:
        (**(code **)(lVar4 + 0x1648))(GVar1,1,0,local_238);
        break;
      case UNIFORM_FUNCTION_MATRIX4X3DV:
        (**(code **)(lVar4 + 0x1658))(GVar1,1,0,local_238);
      }
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x502) {
        local_1b0._0_8_ =
             ((local_240->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_01 = this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        __s = getUniformFunctionString(this_01,func);
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible type."
                   ,0x67);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        std::ios_base::~ios_base(local_138);
        bVar7 = false;
      }
      func = func + UNIFORM_FUNCTION_1DV;
    } while (func != UNIFORM_FUNCTION_COUNT);
    local_248 = local_248 + 1;
  } while (local_248 != 0x10);
  return bVar7;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const glw::GLint nondouble_uniform_locations[] = { m_po_bool_uniform_location,  m_po_bvec2_uniform_location,
													   m_po_bvec3_uniform_location, m_po_bvec4_uniform_location,
													   m_po_float_uniform_location, m_po_int_uniform_location,
													   m_po_ivec2_uniform_location, m_po_ivec3_uniform_location,
													   m_po_ivec4_uniform_location, m_po_uint_uniform_location,
													   m_po_uvec2_uniform_location, m_po_uvec3_uniform_location,
													   m_po_uvec4_uniform_location, m_po_vec2_uniform_location,
													   m_po_vec3_uniform_location,  m_po_vec4_uniform_location };
	const unsigned int n_nondouble_uniform_locations =
		sizeof(nondouble_uniform_locations) / sizeof(nondouble_uniform_locations[0]);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_nondouble_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = nondouble_uniform_locations[n_uniform_location];

		for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST);
			 function < static_cast<int>(UNIFORM_FUNCTION_COUNT); ++function)
		{
			switch (static_cast<_uniform_function>(function))
			{
			case UNIFORM_FUNCTION_1D:
				gl.uniform1d(uniform_location, 0.0);
				break;
			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_2D:
				gl.uniform2d(uniform_location, 0.0, 1.0);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_3D:
				gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_4D:
				gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1, double_data);
				break;

			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;

			default:
			{
				DE_ASSERT(false);
			}
			} /* switch (function) */

			error_code = gl.getError();
			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << getUniformFunctionString(static_cast<_uniform_function>(function))
								   << "() function did not generate GL_INVALID_OPERATION error when called for"
									  " a uniform of incompatible type."
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	} /* for (all checks) */

	return result;
}